

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_cwksp.h
# Opt level: O0

void * duckdb_zstd::ZSTD_cwksp_reserve_internal_buffer_space(ZSTD_cwksp *ws,size_t bytes)

{
  void *pvVar1;
  long in_RSI;
  ZSTD_cwksp *in_RDI;
  void *bottom;
  void *alloc;
  void *local_8;
  
  local_8 = (void *)((long)in_RDI->allocStart - in_RSI);
  pvVar1 = in_RDI->tableEnd;
  ZSTD_cwksp_assert_internal_consistency(in_RDI);
  if (local_8 < pvVar1) {
    in_RDI->allocFailed = '\x01';
    local_8 = (void *)0x0;
  }
  else {
    if (local_8 < in_RDI->tableValidEnd) {
      in_RDI->tableValidEnd = local_8;
    }
    in_RDI->allocStart = local_8;
  }
  return local_8;
}

Assistant:

MEM_STATIC void*
ZSTD_cwksp_reserve_internal_buffer_space(ZSTD_cwksp* ws, size_t const bytes)
{
    void* const alloc = (BYTE*)ws->allocStart - bytes;
    void* const bottom = ws->tableEnd;
    DEBUGLOG(5, "cwksp: reserving %p %zd bytes, %zd bytes remaining",
        alloc, bytes, ZSTD_cwksp_available_space(ws) - bytes);
    ZSTD_cwksp_assert_internal_consistency(ws);
    assert(alloc >= bottom);
    if (alloc < bottom) {
        DEBUGLOG(4, "cwksp: alloc failed!");
        ws->allocFailed = 1;
        return NULL;
    }
    /* the area is reserved from the end of wksp.
     * If it overlaps with tableValidEnd, it voids guarantees on values' range */
    if (alloc < ws->tableValidEnd) {
        ws->tableValidEnd = alloc;
    }
    ws->allocStart = alloc;
    return alloc;
}